

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# edata.h
# Opt level: O2

void edata_init(edata_t *edata,uint arena_ind,void *addr,size_t size,_Bool slab,szind_t szind,
               uint64_t sn,extent_state_t state,_Bool zeroed,_Bool committed,extent_pai_t pai,
               extent_head_state_t is_head)

{
  undefined7 in_register_00000081;
  undefined3 in_stack_00000019;
  
  edata->e_addr = addr;
  (edata->field_2).e_size_esn = (uint)(edata->field_2).e_size_esn & 0xfff | size;
  edata->e_sn = CONCAT71(in_register_00000081,slab);
  edata->e_bits =
       (ulong)(_zeroed == 1) << 0x2c |
       (ulong)(szind & 0x77fff8bf) << 0x11 | (sn & 0xff) << 0xf |
       (ulong)(byte)(undefined1)state << 0xd |
       (ulong)(arena_ind & 0xf0000fff) | edata->e_bits & 0xffffeffff0000000 | 0xe800000;
  return;
}

Assistant:

static inline void
edata_init(edata_t *edata, unsigned arena_ind, void *addr, size_t size,
    bool slab, szind_t szind, uint64_t sn, extent_state_t state, bool zeroed,
    bool committed, extent_pai_t pai, extent_head_state_t is_head) {
	assert(addr == PAGE_ADDR2BASE(addr) || !slab);

	edata_arena_ind_set(edata, arena_ind);
	edata_addr_set(edata, addr);
	edata_size_set(edata, size);
	edata_slab_set(edata, slab);
	edata_szind_set(edata, szind);
	edata_sn_set(edata, sn);
	edata_state_set(edata, state);
	edata_guarded_set(edata, false);
	edata_zeroed_set(edata, zeroed);
	edata_committed_set(edata, committed);
	edata_pai_set(edata, pai);
	edata_is_head_set(edata, is_head == EXTENT_IS_HEAD);
	if (config_prof) {
		edata_prof_tctx_set(edata, NULL);
	}
}